

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O3

void __thiscall libnbt::NBTTagData<int>::setType(NBTTagData<int> *this)

{
  char *__s1;
  int iVar1;
  char cVar2;
  
  __s1 = _put;
  cVar2 = '\x01';
  if (_put == _get) goto LAB_00104463;
  if (*_put == '*') {
    if (_put == _widen) {
      cVar2 = '\x02';
      goto LAB_00104463;
    }
  }
  else {
    iVar1 = strcmp(_put,_get);
    if (iVar1 == 0) goto LAB_00104463;
    cVar2 = '\x02';
    if (__s1 == _widen) goto LAB_00104463;
    iVar1 = strcmp(__s1,_widen);
    if (iVar1 == 0) goto LAB_00104463;
  }
  cVar2 = '\x03';
LAB_00104463:
  (this->super_NBTBase).type = cVar2;
  return;
}

Assistant:

void setType() {
            if (typeid(T) == typeid(int8_t)) {
                type = BYTE;
            } else if (typeid(T) == typeid(int16_t)) {
                type = SHORT;
            } else if (typeid(T) == typeid(int32_t)) {
                type = INT;
            } else if (typeid(T) == typeid(int64_t)) {
                type = LONG;
            } else if (typeid(T) == typeid(float)) {
                type = FLOAT;
            } else if (typeid(T) == typeid(double)) {
                type = DOUBLE;
            } else if (typeid(T) == typeid(std::string)) {
                type = STRING;
            } else {
                type = END;
            }
        }